

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

ptr<resp_msg> __thiscall
nuraft::raft_server::process_req(raft_server *this,req_msg *req,req_ext_params *ext_params)

{
  pointer psVar1;
  _func_int **pp_Var2;
  bool bVar3;
  ReturnCode RVar4;
  int iVar5;
  uint uVar6;
  msg_type type;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  ptr<resp_msg> pVar8;
  Param param;
  string local_80;
  int32 local_60;
  int local_5c;
  unique_lock<std::recursive_mutex> guard;
  Param local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  
  local_48.myId =
       *(int32_t *)
        &(req->log_entries_).
         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_48.leaderId = *(int32_t *)((long)&req->commit_idx_ + 4);
  local_48.peerId = -1;
  local_48.ctx = ext_params;
  RVar4 = cb_func::call((cb_func *)(*(long *)&req[4].super_msg_base.dst_ + 0x70),ProcessReq,
                        &local_48);
  psVar1 = req[9].log_entries_.
           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  _Var7._M_pi = extraout_RDX;
  if (RVar4 == ReturnNull) {
    if (psVar1 != (pointer)0x0) {
      iVar5 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var7._M_pi = extraout_RDX_03;
      if (2 < iVar5) {
        psVar1 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_((string *)&param,"by callback, return null");
        (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar1,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"process_req",0x28a,(string *)&param);
LAB_00148fda:
        std::__cxx11::string::~string((string *)&param);
        _Var7._M_pi = extraout_RDX_04;
      }
    }
  }
  else {
    if (psVar1 != (pointer)0x0) {
      iVar5 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var7._M_pi = extraout_RDX_00;
      if (4 < iVar5) {
        psVar1 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_type_to_string_abi_cxx11_
                  (&local_80,
                   (nuraft *)
                   (ulong)*(uint *)&(ext_params->after_precommit_).super__Function_base._M_manager,
                   (msg_type)extraout_RDX_00);
        msg_if_given_abi_cxx11_
                  ((string *)&param,
                   "Receive a %s message from %d with LastLogIndex=%lu, LastLogTerm %lu, EntriesLength=%zu, CommitIndex=%lu and Term=%lu"
                   ,local_80._M_dataplus._M_p,
                   (ulong)*(uint *)((long)&(ext_params->after_precommit_).super__Function_base.
                                           _M_manager + 4),ext_params->context_,
                   ext_params->expected_term_,
                   (long)ext_params[1].after_precommit_.super__Function_base._M_manager -
                   *(long *)((long)&ext_params[1].after_precommit_.super__Function_base._M_functor +
                            8) >> 4,
                   *(undefined8 *)&ext_params[1].after_precommit_.super__Function_base._M_functor,
                   *(undefined8 *)
                    ((long)&(ext_params->after_precommit_).super__Function_base._M_functor + 8));
        (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"process_req",0x296,&param);
        std::__cxx11::string::~string((string *)&param);
        std::__cxx11::string::~string((string *)&local_80);
        _Var7._M_pi = extraout_RDX_01;
      }
    }
    if (((ulong)req[2].log_entries_.
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000000000) == 0) {
      if (*(int *)&(ext_params->after_precommit_).super__Function_base._M_manager == 5) {
        pVar8 = handle_cli_req_prelock(this,req,ext_params);
        _Var7 = pVar8.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
        goto LAB_00148fea;
      }
      std::unique_lock<std::recursive_mutex>::unique_lock
                (&guard,(mutex_type *)&req[0xc].last_log_term_);
      uVar6 = *(uint *)&(ext_params->after_precommit_).super__Function_base._M_manager;
      if ((uVar6 < 0x11) && ((0x1000aU >> (uVar6 & 0x1f) & 1) != 0)) {
        bVar3 = update_term((raft_server *)req,
                            *(ulong *)((long)&(ext_params->after_precommit_).super__Function_base.
                                              _M_functor + 8));
        if (((char)req[4].super_msg_base.term_ == '\0') &&
           (((bVar3 & ((byte)req[2].last_log_term_ ^ 1)) == 1 &&
            (*(int *)&(ext_params->after_precommit_).super__Function_base._M_manager == 1)))) {
          decay_target_priority((raft_server *)req);
        }
        if (0 < *(int *)((long)&req[4].super_msg_base.term_ + 4)) {
          *(undefined4 *)((long)&req[4].super_msg_base.term_ + 4) = 2;
        }
        uVar6 = *(uint *)&(ext_params->after_precommit_).super__Function_base._M_manager;
      }
      this->_vptr_raft_server = (_func_int **)0x0;
      (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
      ;
      if (uVar6 == 1) {
        handle_vote_req((raft_server *)&param,req);
LAB_0014923f:
        std::__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2> *)&param);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&param.peerId);
      }
      else {
        if (uVar6 == 0x18) {
          handle_priority_change_req((raft_server *)&param,req);
          goto LAB_0014923f;
        }
        if (uVar6 == 0x12) {
          psVar1 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (psVar1 != (pointer)0x0) {
            iVar5 = (*(code *)(psVar1->
                              super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr[1].buff_.
                              super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ();
            if (3 < iVar5) {
              psVar1 = req[9].log_entries_.
                       super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
              msg_if_given_abi_cxx11_
                        ((string *)&param,"got ping from %d",
                         (ulong)*(uint *)((long)&(ext_params->after_precommit_).super__Function_base
                                                 ._M_manager + 4));
              (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)(psVar1,4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                               ,"process_req",0x2cf,&param);
              std::__cxx11::string::~string((string *)&param);
            }
          }
          local_80._M_dataplus._M_p = (pointer)req[9].super_msg_base._vptr_msg_base[1];
          local_5c = 0x13;
          local_60 = *(int32 *)((long)&(ext_params->after_precommit_).super__Function_base.
                                       _M_manager + 4);
          std::make_shared<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int>
                    ((unsigned_long *)&param,(msg_type *)&local_80,&local_5c,
                     (int *)&req->log_entries_);
          goto LAB_0014923f;
        }
        if (uVar6 == 0x14) {
          handle_prevote_req((raft_server *)&param,req);
          goto LAB_0014923f;
        }
        if (uVar6 != 3) {
          handle_ext_msg((raft_server *)&param,req);
          goto LAB_0014923f;
        }
        param.myId = *(int32_t *)
                      &(req->log_entries_).
                       super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        param.leaderId = *(int32_t *)((long)&req->commit_idx_ + 4);
        param.peerId = *(int32_t *)
                        ((long)&(ext_params->after_precommit_).super__Function_base._M_manager + 4);
        param.ctx = ext_params;
        cb_func::call((cb_func *)(*(long *)&req[4].super_msg_base.dst_ + 0x70),
                      ReceivedAppendEntriesReq,&param);
        handle_append_entries((raft_server *)&param,req);
        std::__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2> *)&param);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&param.peerId);
        param.myId = *(int32_t *)
                      &(req->log_entries_).
                       super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        param.leaderId = *(int32_t *)((long)&req->commit_idx_ + 4);
        param.peerId = *(int32_t *)
                        ((long)&(ext_params->after_precommit_).super__Function_base._M_manager + 4);
        param.ctx = this->_vptr_raft_server;
        cb_func::call((cb_func *)(*(long *)&req[4].super_msg_base.dst_ + 0x70),SentAppendEntriesResp
                      ,&param);
      }
      if ((this->_vptr_raft_server != (_func_int **)0x0) &&
         (psVar1 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage, psVar1 != (pointer)0x0)) {
        iVar5 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
        if (4 < iVar5) {
          psVar1 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          msg_type_to_string_abi_cxx11_
                    (&local_80,(nuraft *)(ulong)*(uint *)(this->_vptr_raft_server + 2),type);
          pp_Var2 = this->_vptr_raft_server;
          msg_if_given_abi_cxx11_
                    ((string *)&param,
                     "Response back a %s message to %d with Accepted=%d, Term=%lu, NextIndex=%lu",
                     local_80._M_dataplus._M_p,(ulong)*(uint *)(pp_Var2 + 3),
                     (ulong)*(byte *)(pp_Var2 + 6),pp_Var2[1],pp_Var2[4]);
          (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)
                    (psVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"process_req",0x2e4,&param);
          std::__cxx11::string::~string((string *)&param);
          std::__cxx11::string::~string((string *)&local_80);
        }
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
      _Var7._M_pi = extraout_RDX_05;
      goto LAB_00148fea;
    }
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar1 != (pointer)0x0) {
      iVar5 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var7._M_pi = extraout_RDX_02;
      if (2 < iVar5) {
        psVar1 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_((string *)&param,"stopping, return null");
        (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar1,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"process_req",0x29a,(string *)&param);
        goto LAB_00148fda;
      }
    }
  }
  this->_vptr_raft_server = (_func_int **)0x0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
LAB_00148fea:
  pVar8.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  pVar8.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar8.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::process_req(req_msg& req,
                                       const req_ext_params& ext_params) {
    cb_func::Param param(id_, leader_);
    param.ctx = &req;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::ProcessReq, &param);
    if (rc == CbReturnCode::ReturnNull) {
        p_wn("by callback, return null");
        return nullptr;
    }

    p_db( "Receive a %s message from %d with LastLogIndex=%" PRIu64 ", "
          "LastLogTerm %" PRIu64 ", EntriesLength=%zu, CommitIndex=%" PRIu64 " and Term=%" PRIu64 "",
          msg_type_to_string(req.get_type()).c_str(),
          req.get_src(),
          req.get_last_log_idx(),
          req.get_last_log_term(),
          req.log_entries().size(),
          req.get_commit_idx(),
          req.get_term() );

    if (stopping_) {
        // Shutting down, ignore all incoming messages.
        p_wn("stopping, return null");
        return nullptr;
    }

    if ( req.get_type() == msg_type::client_request ) {
        // Client request doesn't need to go through below process.
        return handle_cli_req_prelock(req, ext_params);
    }

    recur_lock(lock_);
    if ( req.get_type() == msg_type::append_entries_request ||
         req.get_type() == msg_type::request_vote_request ||
         req.get_type() == msg_type::install_snapshot_request ) {
        // we allow the server to be continue after term updated to save a round message
        bool term_updated = update_term(req.get_term());

        if ( !im_learner_ &&
             !hb_alive_ &&
             term_updated &&
             req.get_type() == msg_type::request_vote_request ) {
            // If someone has newer term, that means leader has not been
            // elected in the current term, and this node's election timer
            // has been reset by this request.
            // We should decay the target priority here.
            decay_target_priority();
        }

        // Reset stepping down value to prevent this server goes down when leader
        // crashes after sending a LeaveClusterRequest
        if (steps_to_down_ > 0) {
            steps_to_down_ = 2;
        }
    }

    ptr<resp_msg> resp;
    if (req.get_type() == msg_type::append_entries_request) {
        {
            cb_func::Param param(id_, leader_, req.get_src(), &req);
            ctx_->cb_func_.call(cb_func::ReceivedAppendEntriesReq, &param);
        }
        resp = handle_append_entries(req);
        {
            cb_func::Param param(id_, leader_, req.get_src(), resp.get());
            ctx_->cb_func_.call(cb_func::SentAppendEntriesResp, &param);
        }

    } else if (req.get_type() == msg_type::request_vote_request) {
        resp = handle_vote_req(req);

    } else if (req.get_type() == msg_type::pre_vote_request) {
        resp = handle_prevote_req(req);

    } else if (req.get_type() == msg_type::ping_request) {
        p_in("got ping from %d", req.get_src());
        resp = cs_new<resp_msg>( state_->get_term(),
                                 msg_type::ping_response,
                                 id_,
                                 req.get_src() );

    } else if (req.get_type() == msg_type::priority_change_request) {
        resp = handle_priority_change_req(req);

    } else {
        // extended requests
        resp = handle_ext_msg(req);
    }

    if (resp) {
        p_db( "Response back a %s message to %d with Accepted=%d, "
              "Term=%" PRIu64 ", NextIndex=%" PRIu64 "",
              msg_type_to_string(resp->get_type()).c_str(),
              resp->get_dst(),
              resp->get_accepted() ? 1 : 0,
              resp->get_term(),
              resp->get_next_idx() );
    }

    return resp;
}